

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

double ucurr_getRoundingIncrementForUsage_63(UChar *currency,UCurrencyUsage usage,UErrorCode *ec)

{
  UBool UVar1;
  int32_t *piVar2;
  int local_40;
  int local_3c;
  int32_t increment;
  int32_t fracDigits;
  int32_t *data;
  double result;
  UErrorCode *ec_local;
  UCurrencyUsage usage_local;
  UChar *currency_local;
  
  data = (int32_t *)0x0;
  piVar2 = _findMetaData(currency,ec);
  UVar1 = U_SUCCESS(*ec);
  if (UVar1 != '\0') {
    if (usage == UCURR_USAGE_STANDARD) {
      local_3c = *piVar2;
      local_40 = piVar2[1];
    }
    else {
      if (usage != UCURR_USAGE_CASH) {
        *ec = U_UNSUPPORTED_ERROR;
        return 0.0;
      }
      local_3c = piVar2[2];
      local_40 = piVar2[3];
    }
    if ((local_3c < 0) || (9 < local_3c)) {
      *ec = U_INVALID_FORMAT_ERROR;
    }
    else if (1 < local_40) {
      data = (int32_t *)((double)local_40 / (double)POW10[local_3c]);
    }
  }
  return (double)data;
}

Assistant:

U_DRAFT double U_EXPORT2
ucurr_getRoundingIncrementForUsage(const UChar* currency, const UCurrencyUsage usage, UErrorCode* ec) {
    double result = 0.0;

    const int32_t *data = _findMetaData(currency, *ec);
    if (U_SUCCESS(*ec)) {
        int32_t fracDigits;
        int32_t increment;
        switch (usage) {
            case UCURR_USAGE_STANDARD:
                fracDigits = data[0];
                increment = data[1];
                break;
            case UCURR_USAGE_CASH:
                fracDigits = data[2];
                increment = data[3];
                break;
            default:
                *ec = U_UNSUPPORTED_ERROR;
                return result;
        }

        // If the meta data is invalid, return 0.0
        if (fracDigits < 0 || fracDigits > MAX_POW10) {
            *ec = U_INVALID_FORMAT_ERROR;
        } else {
            // A rounding value of 0 or 1 indicates no rounding.
            if (increment >= 2) {
                // Return (increment) / 10^(fracDigits).  The only actual rounding data,
                // as of this writing, is CHF { 2, 5 }.
                result = double(increment) / POW10[fracDigits];
            }
        }
    }

    return result;
}